

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O2

adjusted_mantissa fast_float::positive_digit_comp<double>(bigint *bigmant,int32_t exponent)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  double in_XMM0_Qa;
  adjusted_mantissa aVar6;
  anon_class_1_1_756fe65e local_2a;
  bool truncated;
  adjusted_mantissa local_28;
  
  bigint::pow10(bigmant,in_XMM0_Qa);
  local_28.mantissa = bigint::hi64(bigmant,&truncated);
  iVar1 = bigint::bit_length(bigmant);
  local_28.power2 = iVar1 + 0x3f3;
  local_2a.truncated = truncated;
  if (iVar1 < -0x3fd) {
    uVar3 = 0x40;
    if (-iVar1 - 0x3f2U < 0x40) {
      uVar3 = -iVar1 - 0x3f2U;
    }
    positive_digit_comp<double>::anon_class_1_1_756fe65e::operator()(&local_2a,&local_28,uVar3);
    uVar4 = (ulong)(0xfffffffffffff < local_28.mantissa);
  }
  else {
    positive_digit_comp<double>::anon_class_1_1_756fe65e::operator()(&local_2a,&local_28,0xb);
    bVar5 = local_28.mantissa >> 0x35 != 0;
    local_28.mantissa = local_28.mantissa & 0xfffffffffffff;
    if (bVar5) {
      local_28.mantissa = 0;
    }
    uVar2 = (uint)bVar5 + local_28.power2;
    uVar3 = uVar2;
    if (0x7fe < (int)uVar2) {
      uVar3 = 0x7ff;
    }
    uVar4 = (ulong)uVar3;
    if (0x7fe < (int)uVar2) {
      local_28.mantissa = 0;
    }
  }
  aVar6._8_8_ = uVar4;
  aVar6.mantissa = local_28.mantissa;
  return aVar6;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa positive_digit_comp(bigint& bigmant, int32_t exponent) noexcept {
  FASTFLOAT_ASSERT(bigmant.pow10(uint32_t(exponent)));
  adjusted_mantissa answer;
  bool truncated;
  answer.mantissa = bigmant.hi64(truncated);
  int bias = binary_format<T>::mantissa_explicit_bits() - binary_format<T>::minimum_exponent();
  answer.power2 = bigmant.bit_length() - 64 + bias;

  round<T>(answer, [truncated](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [truncated](bool is_odd, bool is_halfway, bool is_above) -> bool {
      return is_above || (is_halfway && truncated) || (is_odd && is_halfway);
    });
  });

  return answer;
}